

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FS.cpp
# Opt level: O2

void __thiscall Path::Path(Path *this,string *in)

{
  string sStack_38;
  
  (this->_original)._M_dataplus._M_p = (pointer)&(this->_original).field_2;
  (this->_original)._M_string_length = 0;
  (this->_original).field_2._M_local_buf[0] = '\0';
  (this->_data)._M_dataplus._M_p = (pointer)&(this->_data).field_2;
  (this->_data)._M_string_length = 0;
  (this->_data).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  expand(&sStack_38,in);
  std::__cxx11::string::operator=((string *)&this->_data,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

Path::Path (const std::string& in)
{
  _original = in;
  _data     = expand (in);
}